

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 in_RAX;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  int col;
  undefined4 uVar8;
  float local_80 [2];
  Vector<float,_3> res_1;
  float local_68 [2];
  Vector<float,_3> res_2;
  Type in0;
  float local_28 [8];
  undefined8 local_8;
  
  pfVar1 = res_2.m_data + 2;
  local_8 = in_RAX;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar2 != lVar6) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar6) = uVar8;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x24);
      lVar5 = lVar5 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0xc;
    } while (lVar5 != 3);
    stack0xffffffffffffffa8 = *(undefined8 *)evalCtx->in[0].m_data;
  }
  else {
    stack0xffffffffffffffa8 = 0;
    puVar3 = &s_constInMat3x3;
    lVar2 = 0;
    do {
      lVar5 = 0;
      pfVar4 = pfVar1;
      do {
        *pfVar4 = (float)puVar3[lVar5];
        lVar5 = lVar5 + 1;
        pfVar4 = pfVar4 + 3;
      } while (lVar5 != 3);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 3;
    } while (lVar2 != 3);
  }
  pfVar1 = local_28;
  local_28[4] = 0.0;
  local_28[5] = 0.0;
  local_28[6] = 0.0;
  local_28[7] = 0.0;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  local_8 = (ulong)local_8._4_4_ << 0x20;
  lVar2 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar2 != lVar6) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar1 + lVar6) = uVar8;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x24);
    lVar5 = lVar5 + 1;
    pfVar1 = pfVar1 + 1;
    lVar2 = lVar2 + 0xc;
  } while (lVar5 != 3);
  pfVar1 = local_28;
  pfVar4 = res_2.m_data + 2;
  lVar2 = 0;
  do {
    lVar5 = 0;
    pfVar7 = pfVar4;
    do {
      pfVar1[lVar5] = *pfVar7;
      lVar5 = lVar5 + 1;
      pfVar7 = pfVar7 + 3;
    } while (lVar5 != 3);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 3;
    pfVar4 = pfVar4 + 1;
  } while (lVar2 != 3);
  res_1.m_data._0_8_ = res_1.m_data._0_8_ & 0xffffffff00000000;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2 + -2] = local_28[lVar2] + local_28[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  res_2.m_data[0] = 0.0;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2 + -2] = res_1.m_data[lVar2 + -2] + local_28[lVar2 + 6];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 1.4013e-45;
  res_1.m_data[2] = 2.8026e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)res_1.m_data[lVar2 + -2]] = res_1.m_data[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}